

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O2

void __thiscall
LightMask::blur(LightMask *this,vector<float,_std::allocator<float>_> *from,
               vector<float,_std::allocator<float>_> *to,int rad)

{
  int iVar1;
  pointer pfVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int ky;
  long lVar11;
  float *pfVar12;
  long lVar13;
  float fVar14;
  
  iVar3 = rad * 2 + 1;
  lVar7 = (long)this->width_;
  lVar6 = (long)rad;
  iVar1 = this->height_;
  iVar4 = 0;
  for (lVar8 = lVar6; lVar8 < lVar7 - lVar6; lVar8 = lVar8 + 1) {
    pfVar2 = (to->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar10 = 0;
    for (lVar13 = lVar6; lVar13 < iVar1 - lVar6; lVar13 = lVar13 + 1) {
      pfVar5 = (float *)((long)(from->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start +
                        lVar7 * 4 * (long)iVar10 + (long)iVar4 * 4);
      fVar14 = 0.0;
      for (lVar9 = (long)iVar4; lVar11 = (long)iVar10, pfVar12 = pfVar5, lVar9 <= lVar8 + lVar6;
          lVar9 = lVar9 + 1) {
        for (; lVar11 <= lVar6 + lVar13; lVar11 = lVar11 + 1) {
          fVar14 = fVar14 + *pfVar12;
          pfVar12 = pfVar12 + lVar7;
        }
        pfVar5 = pfVar5 + 1;
      }
      pfVar2[lVar8 + lVar13 * lVar7] = fVar14 / (float)(iVar3 * iVar3);
      iVar10 = iVar10 + 1;
    }
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void blur(const std::vector<float>& from, std::vector<float>& to, int rad)
    {
        // number of tiles in the kernel
        const int numtiles = ((2 * rad) + 1) * ((2 * rad) + 1);

        //std::vector<float> blur(width*height, 0.0f);
        for (int i = rad; i < width_-rad; i++)
        {
            for (int j = rad; j < height_-rad; j++)
            {
                // Compute the sum of all values in the kernel
                float sum = 0.0f;
                for (int kx = i-rad; kx <= i+rad; kx++)
                {
                    for (int ky = j-rad; ky <= j+rad; ky++)
                    {
                        sum += from[kx + ky * width_];
                    }
                }

                // Average the value
                float avg = sum / numtiles;
                to[i + j * width_] = avg;
            }
        }
    }